

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O2

void __thiscall
fmt::internal::BasicArgFormatter<fmt::internal::ArgFormatter<wchar_t>,_wchar_t>::visit_char
          (BasicArgFormatter<fmt::internal::ArgFormatter<wchar_t>,_wchar_t> *this,int value)

{
  wchar_t fill_00;
  Alignment AVar1;
  FormatSpec *pFVar2;
  CharPtr buffer;
  FormatError *this_00;
  ulong n;
  wchar_t fill;
  WidthSpec local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  pFVar2 = this->spec_;
  if ((pFVar2->type_ == '\0') || (pFVar2->type_ == 'c')) {
    if (((pFVar2->super_AlignSpec).align_ == ALIGN_NUMERIC) || (pFVar2->flags_ != 0)) {
      this_00 = (FormatError *)__cxa_allocate_exception(0x10);
      FormatError::FormatError(this_00,(CStringRef)0x20b757);
      __cxa_throw(this_00,&FormatError::typeinfo,std::runtime_error::~runtime_error);
    }
    fill_00 = (pFVar2->super_AlignSpec).super_WidthSpec.fill_;
    n = (ulong)(pFVar2->super_AlignSpec).super_WidthSpec.width_;
    fill = fill_00;
    if (n < 2) {
      buffer = BasicWriter<wchar_t>::grow_buffer(this->writer_,1);
    }
    else {
      buffer = BasicWriter<wchar_t>::grow_buffer(this->writer_,n);
      pFVar2 = this->spec_;
      AVar1 = (pFVar2->super_AlignSpec).align_;
      if (AVar1 == ALIGN_CENTER) {
        buffer = BasicWriter<wchar_t>::fill_padding
                           (buffer,(pFVar2->super_AlignSpec).super_WidthSpec.width_,1,fill_00);
      }
      else if (AVar1 == ALIGN_RIGHT) {
        std::__fill_n_a<wchar_t*,unsigned_int,wchar_t>
                  (buffer,(pFVar2->super_AlignSpec).super_WidthSpec.width_ - 1,&fill);
        buffer = buffer + ((this->spec_->super_AlignSpec).super_WidthSpec.width_ - 1);
      }
      else {
        std::__fill_n_a<wchar_t*,unsigned_int,wchar_t>
                  (buffer + 1,(pFVar2->super_AlignSpec).super_WidthSpec.width_ - 1,&fill);
      }
    }
    *buffer = value;
  }
  else {
    *(byte *)&pFVar2->flags_ = (byte)pFVar2->flags_ | 0x10;
    local_28._0_4_ = pFVar2->precision_;
    local_28._4_1_ = pFVar2->type_;
    local_28._5_3_ = *(undefined3 *)&pFVar2->field_0x15;
    local_38 = (pFVar2->super_AlignSpec).super_WidthSpec;
    uStack_30 = *(undefined8 *)&(pFVar2->super_AlignSpec).align_;
    BasicWriter<wchar_t>::write_int<int,fmt::FormatSpec>(this->writer_,value,*pFVar2);
  }
  return;
}

Assistant:

void visit_char(int value) {
    if (spec_.type_ && spec_.type_ != 'c') {
      spec_.flags_ |= CHAR_FLAG;
      writer_.write_int(value, spec_);
      return;
    }
    if (spec_.align_ == ALIGN_NUMERIC || spec_.flags_ != 0)
      FMT_THROW(FormatError("invalid format specifier for char"));
    typedef typename BasicWriter<Char>::CharPtr CharPtr;
    Char fill = internal::CharTraits<Char>::cast(spec_.fill());
    CharPtr out = CharPtr();
    const unsigned char_width = 1;
    if (spec_.width_ > char_width) {
      out = writer_.grow_buffer(spec_.width_);
      if (spec_.align_ == ALIGN_RIGHT) {
        std::fill_n(out, spec_.width_ - char_width, fill);
        out += spec_.width_ - char_width;
      } else if (spec_.align_ == ALIGN_CENTER) {
        out = writer_.fill_padding(out, spec_.width_,
                                   internal::check(char_width), fill);
      } else {
        std::fill_n(out + char_width, spec_.width_ - char_width, fill);
      }
    } else {
      out = writer_.grow_buffer(char_width);
    }
    *out = internal::CharTraits<Char>::cast(value);
  }